

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KBO.cpp
# Opt level: O0

KBO * Kernel::KBO::testKBO(bool rand,bool qkbo)

{
  uint uVar1;
  byte in_DL;
  byte in_SIL;
  KBO *in_RDI;
  bool bVar2;
  anon_class_8_1_8990f923 prec;
  anon_class_1_0_00000001 predLevels;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff2c;
  int in_stack_ffffffffffffff64;
  undefined2 uVar3;
  DArray<int> *in_stack_ffffffffffffff68;
  DArray<int> *in_stack_ffffffffffffff70;
  DArray<int> *in_stack_ffffffffffffff78;
  DArray<int> *in_stack_ffffffffffffff80;
  KboWeightMap<Kernel::FuncSigTraits> *in_stack_ffffffffffffff88;
  KBO *in_stack_ffffffffffffff90;
  
  bVar2 = (in_SIL & 1) == 0;
  if (bVar2) {
    KboWeightMap<Kernel::FuncSigTraits>::dflt(SUB41((uint)in_stack_ffffffffffffff2c >> 0x18,0));
  }
  else {
    KboWeightMap<Kernel::FuncSigTraits>::randomized
              (SUB41((uint)in_stack_ffffffffffffff0c >> 0x18,0));
  }
  Signature::functions((Signature *)0x886684);
  testKBO::anon_class_8_1_8990f923::operator()
            ((anon_class_8_1_8990f923 *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
  Signature::typeCons((Signature *)0x8866b5);
  testKBO::anon_class_8_1_8990f923::operator()
            ((anon_class_8_1_8990f923 *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
  Signature::predicates((Signature *)0x8866e3);
  testKBO::anon_class_8_1_8990f923::operator()
            ((anon_class_8_1_8990f923 *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
  uVar3 = (undefined2)((uint)in_stack_ffffffffffffff64 >> 0x10);
  testKBO::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  uVar1 = (uint)(in_DL & 1);
  KBO(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
      in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
      SUB21((ushort)uVar3 >> 8,0),SUB21(uVar3,0));
  Lib::DArray<int>::~DArray((DArray<int> *)CONCAT44(in_stack_ffffffffffffff14,uVar1));
  Lib::DArray<int>::~DArray((DArray<int> *)CONCAT44(in_stack_ffffffffffffff14,uVar1));
  Lib::DArray<int>::~DArray((DArray<int> *)CONCAT44(in_stack_ffffffffffffff14,uVar1));
  Lib::DArray<int>::~DArray((DArray<int> *)CONCAT44(in_stack_ffffffffffffff14,uVar1));
  if (bVar2) {
    KboWeightMap<Kernel::FuncSigTraits>::~KboWeightMap
              ((KboWeightMap<Kernel::FuncSigTraits> *)0x88679b);
  }
  else {
    KboWeightMap<Kernel::FuncSigTraits>::~KboWeightMap
              ((KboWeightMap<Kernel::FuncSigTraits> *)0x8867b4);
  }
  return in_RDI;
}

Assistant:

KBO KBO::testKBO(bool rand, bool qkbo)
{
  auto predLevels = []() -> DArray<int>
    { return PrecedenceOrdering::testLevels(); };

  auto prec = [&](int size) {
    auto out = DArray<int>::fromIterator(range(0,size));
    if (rand) {
      Shuffling::shuffleArray(out, size);
    }
    return out;
  };
  return KBO(
      rand ? KboWeightMap<FuncSigTraits>::randomized(qkbo) : KboWeightMap<FuncSigTraits>::dflt(qkbo),
#if __KBO__CUSTOM_PREDICATE_WEIGHTS__
      rand ? KboWeightMap<PredSigTraits>::randomized(qkbo) : KboWeightMap<PredSigTraits>::dflt(qkbo),
#endif
      prec(env.signature->functions()),
      prec(env.signature->typeCons()),
      prec(env.signature->predicates()),
      predLevels(),
      /*reverseLCM=*/false,
      qkbo);
}